

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LameWrapper.cpp
# Opt level: O0

void __thiscall cinemo::LameWrapper::LameWrapper(LameWrapper *this,string *dir,string *file)

{
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [48];
  string *local_20;
  string *file_local;
  string *dir_local;
  LameWrapper *this_local;
  
  local_20 = (string *)file;
  file_local = dir;
  dir_local = &this->dir;
  std::__cxx11::string::string((string *)this,(string *)dir);
  std::__cxx11::string::string((string *)&this->file,local_20);
  std::operator+(local_50,(char *)file_local);
  std::operator+(&this->path,local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::unique_ptr<cinemo::wh::WaveHeader,std::default_delete<cinemo::wh::WaveHeader>>::
  unique_ptr<std::default_delete<cinemo::wh::WaveHeader>,void>
            ((unique_ptr<cinemo::wh::WaveHeader,std::default_delete<cinemo::wh::WaveHeader>> *)
             &this->wh);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->message_buffer,"",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  this->initDone = false;
  this->isBusy = false;
  this->isDone = false;
  this->quality = 3;
  return;
}

Assistant:

LameWrapper::LameWrapper(const string& dir, const string& file)
            : dir(dir), file(file), path(dir + "/" + file),
              wh(), message_buffer(""), initDone(false),
              isBusy(false), isDone(false) {
    }